

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

void __thiscall Matrix<double>::swap(Matrix<double> *this,uint row1,uint row2)

{
  reference pvVar1;
  reference this_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_01;
  undefined1 local_30 [8];
  vector<double,_std::allocator<double>_> mat_row;
  uint row2_local;
  uint row1_local;
  Matrix<double> *this_local;
  
  this_01 = &this->m_elems;
  mat_row.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = row2;
  mat_row.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = row1;
  pvVar1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](this_01,(ulong)row1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_30,pvVar1);
  pvVar1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](this_01,(ulong)(uint)mat_row.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[](this_01,(ulong)mat_row.super__Vector_base<double,_std::allocator<double>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  std::vector<double,_std::allocator<double>_>::operator=(this_00,pvVar1);
  pvVar1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->m_elems,
                        (ulong)(uint)mat_row.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::operator=
            (pvVar1,(vector<double,_std::allocator<double>_> *)local_30);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_30);
  return;
}

Assistant:

void Matrix<T>::swap(unsigned row1, unsigned row2){
    std::vector<T> mat_row=m_elems[row1];
    m_elems[row1]=m_elems[row2];
    m_elems[row2]=mat_row;
}